

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guardedTests.cpp
# Opt level: O0

void __thiscall cow_guarded_cow_guarded_1_Test::TestBody(cow_guarded_cow_guarded_1_Test *this)

{
  bool bVar1;
  type piVar2;
  char *pcVar3;
  element_type *peVar4;
  char *in_R9;
  AssertHelper local_388;
  Message local_380;
  int local_374;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_340;
  Message local_338;
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__4;
  shared_handle data_handle_3;
  Message local_300;
  int local_2f4;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_2c0;
  Message local_2b8;
  bool local_2a9;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_278;
  Message local_270;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__2;
  Message local_248;
  int local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_208;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__1;
  Message local_1d8;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_1;
  shared_handle data_handle2;
  handle data_handle_2;
  thread local_178;
  thread th3;
  thread local_168;
  thread th2;
  thread local_158;
  thread th1;
  Message local_148;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  shared_handle data_handle_1;
  undefined1 local_c0 [8];
  handle data_handle;
  undefined1 local_90 [8];
  cow_guarded<int,_std::timed_mutex> data;
  cow_guarded_cow_guarded_1_Test *this_local;
  
  data_handle.super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  _M_t.super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  _M_t.super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl._4_4_ = 0;
  data.m_writeMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)this;
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::cow_guarded<int>
            ((cow_guarded<int,_std::timed_mutex> *)local_90,
             (int *)((long)&data_handle.
                            super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                            ._M_t.
                            super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                            .super__Head_base<0UL,_int_*,_false> + 4));
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock
            ((handle *)local_c0,(cow_guarded<int,_std::timed_mutex> *)local_90);
  piVar2 = std::unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>::
           operator*((unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                      *)local_c0);
  *piVar2 = *piVar2 + 1;
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::handle::~handle((handle *)local_c0);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock_shared
            ((cow_guarded<int,_std::timed_mutex> *)&gtest_ar_.message_);
  local_f1 = std::operator!=((shared_ptr<const_int> *)&gtest_ar_.message_,(nullptr_t)0x0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_f0,
               (AssertionResult *)"data_handle != nullptr","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x29,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  peVar4 = std::__shared_ptr_access<const_int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<const_int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &gtest_ar_.message_);
  local_13c = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_138,"*data_handle","1",peVar4,&local_13c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x2a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th1,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th1);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  th2._M_id._M_thread = (id)local_90;
  std::thread::thread<cow_guarded_cow_guarded_1_Test::TestBody()::__0,,void>
            (&local_158,(type *)&th2);
  th3._M_id._M_thread = (id)local_90;
  std::thread::thread<cow_guarded_cow_guarded_1_Test::TestBody()::__1,,void>
            (&local_168,(type *)&th3);
  data_handle_2.super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
  ._M_t.super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  _M_t.super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)local_90;
  std::thread::thread<cow_guarded_cow_guarded_1_Test::TestBody()::__2,,void>
            (&local_178,
             (type *)&data_handle_2.
                      super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                      ._M_t.
                      super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                      .super__Head_base<0UL,_int_*,_false>);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&local_178);
  std::thread::~thread(&local_168);
  std::thread::~thread(&local_158);
  std::shared_ptr<const_int>::~shared_ptr((shared_ptr<const_int> *)&gtest_ar_.message_);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock
            ((handle *)
             &data_handle2.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (cow_guarded<int,_std::timed_mutex> *)local_90);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock_shared
            ((cow_guarded<int,_std::timed_mutex> *)&gtest_ar_1.message_);
  piVar2 = std::unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>::
           operator*((unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                      *)&data_handle2.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  *piVar2 = *piVar2 + 1;
  piVar2 = std::unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>::
           operator*((unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                      *)&data_handle2.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  local_1cc = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1c8,"*data_handle","2",piVar2,&local_1cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_1f1 = std::operator!=((shared_ptr<const_int> *)&gtest_ar_1.message_,(nullptr_t)0x0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_1f0,
               (AssertionResult *)"data_handle2 != nullptr","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  peVar4 = std::__shared_ptr_access<const_int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<const_int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &gtest_ar_1.message_);
  local_23c = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_238,"*data_handle2","1",peVar4,&local_23c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::handle::cancel
            ((handle *)
             &data_handle2.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_261 = std::operator==((unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                               *)&data_handle2.
                                  super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,(nullptr_t)0x0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_260,&local_261,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_260,
               (AssertionResult *)"data_handle == nullptr","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x53,pcVar3);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_2a9 = std::operator!=((shared_ptr<const_int> *)&gtest_ar_1.message_,(nullptr_t)0x0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a8,&local_2a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_2a8,
               (AssertionResult *)"data_handle2 != nullptr","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  peVar4 = std::__shared_ptr_access<const_int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<const_int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &gtest_ar_1.message_);
  local_2f4 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2f0,"*data_handle2","1",peVar4,&local_2f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &data_handle_3.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x56,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &data_handle_3.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_300);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &data_handle_3.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  std::shared_ptr<const_int>::~shared_ptr((shared_ptr<const_int> *)&gtest_ar_1.message_);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::handle::~handle
            ((handle *)
             &data_handle2.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock_shared
            ((cow_guarded<int,_std::timed_mutex> *)&gtest_ar__4.message_);
  local_329 = std::operator!=((shared_ptr<const_int> *)&gtest_ar__4.message_,(nullptr_t)0x0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_328,&local_329,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_328,
               (AssertionResult *)"data_handle != nullptr","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  peVar4 = std::__shared_ptr_access<const_int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<const_int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &gtest_ar__4.message_);
  local_374 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_370,"*data_handle","1",peVar4,&local_374);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  std::shared_ptr<const_int>::~shared_ptr((shared_ptr<const_int> *)&gtest_ar__4.message_);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::~cow_guarded
            ((cow_guarded<int,_std::timed_mutex> *)local_90);
  return;
}

Assistant:

TEST(cow_guarded, cow_guarded_1)
{
    cow_guarded<int, std::timed_mutex> data(0);

    {
        auto data_handle = data.lock();

        ++(*data_handle);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle != nullptr);
        EXPECT_EQ(*data_handle, 1);

        std::thread th1([&data]() {
            auto data_handle2 = data.try_lock_shared();
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        std::thread th2([&data]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        std::thread th3([&data]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        th1.join();

        th2.join();
        th3.join();
    }

    {
        auto data_handle = data.lock();

        auto data_handle2 = data.lock_shared();

        ++(*data_handle);
        EXPECT_EQ(*data_handle, 2);

        EXPECT_TRUE(data_handle2 != nullptr);
        EXPECT_EQ(*data_handle2, 1);

        data_handle.cancel();
        EXPECT_TRUE(data_handle == nullptr);

        EXPECT_TRUE(data_handle2 != nullptr);
        EXPECT_EQ(*data_handle2, 1);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle != nullptr);
        EXPECT_EQ(*data_handle, 1);
    }
}